

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequence.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *s,QKeySequence *keysequence)

{
  uint *puVar1;
  ulong uVar2;
  uint *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  uint i;
  quint32 c;
  quint32 MaxKeys;
  quint32 keys [4];
  quint32 *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar3;
  uint line;
  QDataStream *local_48;
  char local_40 [32];
  uint local_20 [2];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20[1] = 4;
  local_20[0] = 0xaaaaaaaa;
  QDataStream::operator>>
            ((QDataStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  memset(local_18,0,0x10);
  uVar3 = 0;
  do {
    line = uVar3;
    puVar1 = qMin<unsigned_int>(local_20,local_20 + 1);
    if (*puVar1 <= uVar3) {
      qAtomicDetach<QKeySequencePrivate>((QKeySequencePrivate **)in_RDI);
      std::copy<unsigned_int*,int*>((uint *)in_RDI,in_RSI,(int *)CONCAT44(line,uVar3));
      local_48 = in_RDI;
LAB_0098d4a9:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_48;
      }
      __stack_chk_fail();
    }
    uVar2 = QDataStream::atEnd();
    if ((uVar2 & 1) != 0) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RDI,(char *)in_RSI,line,(char *)in_stack_ffffffffffffff98);
      QMessageLogger::warning(local_40,"Premature EOF while reading QKeySequence");
      local_48 = in_RDI;
      goto LAB_0098d4a9;
    }
    QDataStream::operator>>((QDataStream *)CONCAT44(line,uVar3),in_stack_ffffffffffffff98);
    uVar3 = line + 1;
  } while( true );
}

Assistant:

QDataStream &operator>>(QDataStream &s, QKeySequence &keysequence)
{
    const quint32 MaxKeys = QKeySequencePrivate::MaxKeyCount;
    quint32 c;
    s >> c;
    quint32 keys[MaxKeys] = {0};
    for (uint i = 0; i < qMin(c, MaxKeys); ++i) {
        if (s.atEnd()) {
            qWarning("Premature EOF while reading QKeySequence");
            return s;
        }
        s >> keys[i];
    }
    qAtomicDetach(keysequence.d);
    std::copy(keys, keys + MaxKeys, QT_MAKE_CHECKED_ARRAY_ITERATOR(keysequence.d->key, MaxKeys));
    return s;
}